

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::Group::Add(Group *this,Base *child)

{
  Base *local_8;
  
  local_8 = child;
  std::vector<args::Base*,std::allocator<args::Base*>>::emplace_back<args::Base*>
            ((vector<args::Base*,std::allocator<args::Base*>> *)&this->children,&local_8);
  return;
}

Assistant:

void Add(Base &child)
            {
                children.emplace_back(&child);
            }